

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void sqlite3ExprCodeAndCache(Parse *pParse,Expr *pExpr,int target)

{
  Vdbe *p;
  int p2;
  
  p = pParse->pVdbe;
  sqlite3ExprCode(pParse,pExpr,target);
  p2 = pParse->nMem + 1;
  pParse->nMem = p2;
  sqlite3VdbeAddOp3(p,0x4e,target,p2,0);
  exprToRegister(pExpr,p2);
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3ExprCodeAndCache(Parse *pParse, Expr *pExpr, int target){
  Vdbe *v = pParse->pVdbe;
  int iMem;

  assert( target>0 );
  assert( pExpr->op!=TK_REGISTER );
  sqlite3ExprCode(pParse, pExpr, target);
  iMem = ++pParse->nMem;
  sqlite3VdbeAddOp2(v, OP_Copy, target, iMem);
  exprToRegister(pExpr, iMem);
}